

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O2

aiMesh * __thiscall Assimp::IFC::TempMesh::ToMesh(TempMesh *this)

{
  pointer paVar1;
  pointer paVar2;
  aiVector3t<double> *__first;
  aiVector3t<double> *__last;
  __uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true> this_00;
  ulong uVar3;
  aiVector3t<float> *__result;
  ulong *puVar4;
  uint *puVar5;
  ulong *puVar6;
  uint n;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  aiFace *paVar10;
  int iVar11;
  pointer __p;
  _Head_base<0UL,_aiMesh_*,_false> _Var12;
  uint i;
  uint uVar13;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> mesh;
  
  paVar1 = (this->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar2 = (this->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar8 = 0;
  for (puVar5 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar5 != (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish; puVar5 = puVar5 + 1) {
    lVar8 = lVar8 + (ulong)*puVar5;
  }
  if (((long)paVar2 - (long)paVar1) / 0x18 == lVar8) {
    if (paVar1 == paVar2) {
      _Var12._M_head_impl = (aiMesh *)0x0;
    }
    else {
      this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
      super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
      super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
           (__uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>)operator_new(0x520);
      aiMesh::aiMesh((aiMesh *)
                     this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                     super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                     super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl);
      __first = (this->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_start;
      __last = (this->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar3 = ((long)__last - (long)__first) / 0x18;
      uVar13 = (uint)uVar3;
      *(uint *)((long)this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                      super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                      super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 4) = uVar13;
      uVar3 = (uVar3 & 0xffffffff) * 0xc;
      mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
      super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
      super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
           (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true>)
           (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true>)
           this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
           super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
           super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
      __result = (aiVector3t<float> *)operator_new__(uVar3);
      if (uVar13 != 0) {
        uVar3 = uVar3 - 0xc;
        memset(__result,0,(uVar3 - uVar3 % 0xc) + 0xc);
      }
      *(aiVector3t<float> **)
       ((long)this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
              super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
              super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x10) = __result;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<aiVector3t<double>*,aiVector3t<float>*>(__first,__last,__result);
      _Var12._M_head_impl = (aiMesh *)mesh;
      uVar3 = (ulong)((long)(this->mVertcnt).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->mVertcnt).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
      *(int *)((long)mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                     super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                     super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8) = (int)uVar3;
      uVar7 = uVar3 & 0xffffffff;
      puVar4 = (ulong *)operator_new__(uVar7 * 0x10 + 8);
      *puVar4 = uVar7;
      puVar4 = puVar4 + 1;
      if ((int)uVar3 != 0) {
        puVar6 = puVar4;
        do {
          *(undefined4 *)puVar6 = 0;
          puVar6[1] = 0;
          puVar6 = puVar6 + 2;
        } while (puVar6 != puVar4 + uVar7 * 2);
      }
      *(ulong **)((long)_Var12._M_head_impl + 0xd0) = puVar4;
      uVar13 = 0;
      uVar7 = 0;
      iVar11 = 0;
      while (uVar13 < (uint)uVar3) {
        uVar9 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar7];
        if ((ulong)uVar9 == 0) {
          uVar9 = (uint)uVar3 - 1;
          (_Var12._M_head_impl)->mNumFaces = uVar9;
        }
        else {
          paVar10 = (_Var12._M_head_impl)->mFaces + uVar13;
          paVar10->mNumIndices = uVar9;
          puVar5 = (uint *)operator_new__((ulong)uVar9 << 2);
          paVar10->mIndices = puVar5;
          for (uVar3 = 0; uVar3 < paVar10->mNumIndices; uVar3 = uVar3 + 1) {
            paVar10->mIndices[uVar3] = iVar11 + (int)uVar3;
          }
          uVar13 = uVar13 + 1;
          uVar9 = *(uint *)((long)mesh._M_t.
                                  super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                                  super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8);
          iVar11 = iVar11 + (int)uVar3;
          _Var12._M_head_impl = (aiMesh *)mesh;
        }
        uVar7 = (ulong)((int)uVar7 + 1);
        uVar3 = (ulong)uVar9;
      }
      mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
      super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
      super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
           (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true>)
           (__uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>)0x0;
      std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr(&mesh);
    }
    return (aiMesh *)(_Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>)_Var12._M_head_impl;
  }
  __assert_fail("mVerts.size() == std::accumulate(mVertcnt.begin(),mVertcnt.end(),size_t(0))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCUtil.cpp"
                ,0x47,"aiMesh *Assimp::IFC::TempMesh::ToMesh()");
}

Assistant:

aiMesh* TempMesh::ToMesh()
{
    ai_assert(mVerts.size() == std::accumulate(mVertcnt.begin(),mVertcnt.end(),size_t(0)));

    if (mVerts.empty()) {
        return NULL;
    }

    std::unique_ptr<aiMesh> mesh(new aiMesh());

    // copy vertices
    mesh->mNumVertices = static_cast<unsigned int>(mVerts.size());
    mesh->mVertices = new aiVector3D[mesh->mNumVertices];
    std::copy(mVerts.begin(),mVerts.end(),mesh->mVertices);

    // and build up faces
    mesh->mNumFaces = static_cast<unsigned int>(mVertcnt.size());
    mesh->mFaces = new aiFace[mesh->mNumFaces];

    for(unsigned int i = 0,n=0, acc = 0; i < mesh->mNumFaces; ++n) {
        aiFace& f = mesh->mFaces[i];
        if (!mVertcnt[n]) {
            --mesh->mNumFaces;
            continue;
        }

        f.mNumIndices = mVertcnt[n];
        f.mIndices = new unsigned int[f.mNumIndices];
        for(unsigned int a = 0; a < f.mNumIndices; ++a) {
            f.mIndices[a] = acc++;
        }

        ++i;
    }

    return mesh.release();
}